

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::renderWithoutRestart(PrimitiveRestartCase *this)

{
  GLenum GVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 local_30;
  deUint32 local_2c;
  int local_20;
  int local_1c;
  int indexArrayNdx;
  int indexArrayStartNdx;
  int numIndices;
  deUint32 restartIndex;
  PrimitiveRestartCase *this_local;
  
  GVar1 = glwGetError();
  glu::checkError(GVar1,"PrimitiveRestartCase::renderWithoutRestart() begin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                  ,0x24a);
  if (this->m_indexType == INDEX_UNSIGNED_BYTE) {
    local_2c = 0xff;
  }
  else {
    if (this->m_indexType == INDEX_UNSIGNED_SHORT) {
      local_30 = 0xffff;
    }
    else {
      local_30 = 0;
      if (this->m_indexType == INDEX_UNSIGNED_INT) {
        local_30 = 0xffffffff;
      }
    }
    local_2c = local_30;
  }
  glwDisable(0x8d69);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"Disable primitive restart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                  ,0x254);
  glwClear(0x4500);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"Clear in PrimitiveRestartCase::renderWithoutRestart()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                  ,0x256);
  iVar2 = getNumIndices(this);
  local_1c = 0;
  for (local_20 = 0; local_20 <= iVar2; local_20 = local_20 + 1) {
    if ((iVar2 <= local_20) || (dVar3 = getIndex(this,local_20), dVar3 == local_2c)) {
      if (local_1c < iVar2) {
        draw(this,local_1c,local_20 - local_1c);
        GVar1 = glwGetError();
        glu::checkError(GVar1,"Draw in PrimitiveRestartCase::renderWithoutRestart()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                        ,0x269);
      }
      local_1c = local_20 + 1;
    }
  }
  GVar1 = glwGetError();
  glu::checkError(GVar1,"PrimitiveRestartCase::renderWithoutRestart() end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                  ,0x270);
  return;
}

Assistant:

void PrimitiveRestartCase::renderWithoutRestart (void)
{
	GLU_CHECK_MSG("PrimitiveRestartCase::renderWithoutRestart() begin");

	deUint32 restartIndex = m_indexType == INDEX_UNSIGNED_BYTE	? RESTART_INDEX_UNSIGNED_BYTE
						  : m_indexType == INDEX_UNSIGNED_SHORT	? RESTART_INDEX_UNSIGNED_SHORT
						  : m_indexType == INDEX_UNSIGNED_INT	? RESTART_INDEX_UNSIGNED_INT
						  : 0;

	DE_ASSERT(restartIndex != 0);

	glDisable(GL_PRIMITIVE_RESTART_FIXED_INDEX);
	GLU_CHECK_MSG("Disable primitive restart");
	glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	GLU_CHECK_MSG("Clear in PrimitiveRestartCase::renderWithoutRestart()");

	// Draw, emulating primitive restart.

	int numIndices = getNumIndices();

	DE_ASSERT(numIndices >= 0);

	int indexArrayStartNdx = 0; // Keep track of the draw start index - first index after a primitive restart, or initially the first index altogether.

	for (int indexArrayNdx = 0; indexArrayNdx <= numIndices; indexArrayNdx++) // \note Goes one "too far" in order to detect end of array as well.
	{
		if (indexArrayNdx >= numIndices || getIndex(indexArrayNdx) == restartIndex) // \note Handle end of array the same way as a restart index encounter.
		{
			if (indexArrayStartNdx < numIndices)
			{
				// Draw from index indexArrayStartNdx to index indexArrayNdx-1 .

				draw(indexArrayStartNdx, indexArrayNdx - indexArrayStartNdx);
				GLU_CHECK_MSG("Draw in PrimitiveRestartCase::renderWithoutRestart()");
			}

			indexArrayStartNdx = indexArrayNdx + 1; // Next draw starts just after this restart index.
		}
	}

	GLU_CHECK_MSG("PrimitiveRestartCase::renderWithoutRestart() end");
}